

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listing_10.1.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  X *pXVar3;
  ostream *poVar4;
  iterator __begin1;
  X *this;
  long lVar5;
  vector<X,_std::allocator<X>_> list;
  vector<X,_std::allocator<X>_> local_48;
  
  local_48.super__Vector_base<X,_std::allocator<X>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<X,_std::allocator<X>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<X,_std::allocator<X>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pXVar3 = (X *)operator_new(0xf0);
  local_48.super__Vector_base<X,_std::allocator<X>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pXVar3 + 5;
  lVar5 = 0;
  do {
    puVar1 = (undefined8 *)((long)&(pXVar3->m).super___mutex_base._M_mutex + lVar5 + 0x1c);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(pXVar3->m).super___mutex_base._M_mutex + lVar5 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(pXVar3->m).super___mutex_base._M_mutex + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0xf0);
  local_48.super__Vector_base<X,_std::allocator<X>_>._M_impl.super__Vector_impl_data._M_finish =
       pXVar3 + 5;
  local_48.super__Vector_base<X,_std::allocator<X>_>._M_impl.super__Vector_impl_data._M_start =
       pXVar3;
  increment_all(&local_48);
  lVar5 = 0xf0;
  this = pXVar3;
  do {
    iVar2 = X::get_value(this);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    this = this + 1;
    lVar5 = lVar5 + -0x30;
  } while (lVar5 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  operator_delete(pXVar3,0xf0);
  return 0;
}

Assistant:

int main() {
  std::vector<X> list(5);
  increment_all(list);
  for (auto const &item : list)
    std::cout << item.get_value() << ", ";
  std::cout << std::endl;
  return 0;
}